

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 __thiscall google::protobuf::Arena::Reset(Arena *this)

{
  AtomicWord AVar1;
  uint64 uVar2;
  Arena *this_local;
  
  AVar1 = internal::SequenceNumber::GetNext((SequenceNumber *)&lifecycle_id_generator_);
  *(AtomicWord *)this = AVar1;
  uVar2 = ResetInternal(this);
  return uVar2;
}

Assistant:

uint64 Arena::Reset() {
  // Invalidate any ThreadCaches pointing to any blocks we just destroyed.
#if !defined(__APPLE__)
  lifecycle_id_ = lifecycle_id_generator_.GetNext();
#else
  lifecycle_id_ = lifecycle_id_generator_ptr->GetNext();
#endif
  return ResetInternal();
}